

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

void compact_with_reopen_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffff688;
  fdb_file_handle *in_stack_fffffffffffff690;
  fdb_doc **in_stack_fffffffffffff698;
  void *in_stack_fffffffffffff6a0;
  fdb_doc **in_stack_fffffffffffff6a8;
  size_t in_stack_fffffffffffff6b0;
  fdb_file_info *in_stack_fffffffffffff6c0;
  fdb_file_handle *in_stack_fffffffffffff6c8;
  fdb_config *in_stack_fffffffffffff8a8;
  char *in_stack_fffffffffffff8b0;
  fdb_file_handle **in_stack_fffffffffffff8b8;
  fdb_kvs_handle *local_600;
  fdb_kvs_handle *second_dbh;
  fdb_file_handle *second_dbfile;
  fdb_file_info info;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char temp [256];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_88;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x100;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  fdb_kvs_open_default
            (in_stack_fffffffffffff690,(fdb_kvs_handle **)in_stack_fffffffffffff688,
             (fdb_kvs_config *)0x105d72);
  pvVar3 = (void *)0x105d89;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"compact_with_reopen_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x105dbc;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x17e);
    compact_with_reopen_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x17e,"void compact_with_reopen_test()");
    }
  }
  for (n = 0; n < 100; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf(temp + 0xf8,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x105ebf;
    metalen = strlen(temp + 0xf8);
    fdb_doc_create(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                   (size_t)in_stack_fffffffffffff688,pvVar3,metalen,(void *)0x105ef6,
                   in_stack_fffffffffffff6b0);
    pvVar3 = (void *)0x105f0f;
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff688 + (long)n * 8));
  }
  fdb_doc_create(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                 (size_t)in_stack_fffffffffffff688,pvVar3,0,(void *)0x105f66,
                 in_stack_fffffffffffff6b0);
  pfStack_88->deleted = true;
  fdb_set((fdb_kvs_handle *)doc,pfStack_88);
  fdb_doc_free((fdb_doc *)0x105f88);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff688,'\0');
  fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
  fdb_kvs_close(in_stack_fffffffffffff688);
  fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  fdb_kvs_open_default
            (in_stack_fffffffffffff690,(fdb_kvs_handle **)in_stack_fffffffffffff688,
             (fdb_kvs_config *)0x105ff2);
  pvVar3 = (void *)0x106009;
  fVar1 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"compact_with_reopen_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x10603c;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x1a0);
    compact_with_reopen_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1a0,"void compact_with_reopen_test()");
    }
  }
  n = 0;
  do {
    if (99 < n) {
      fdb_get_file_info(in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
      iVar2 = strcmp("./compact_test1",(char *)second_dbfile);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1b6);
        compact_with_reopen_test::__test_pass = 0;
        iVar2 = strcmp("./compact_test1",(char *)second_dbfile);
        if (iVar2 != 0) {
          __assert_fail("!strcmp(\"./compact_test1\", info.filename)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1b6,"void compact_with_reopen_test()");
        }
      }
      for (n = 0; n < 100; n = n + 1) {
        sprintf(bodybuf + 0xf8,"newmeta%d",(ulong)(uint)n);
        sprintf(temp + 0xf8,"newbody%d_%s",(ulong)(uint)n,&fconfig.num_blocks_readahead);
        strlen(bodybuf + 0xf8);
        strlen(temp + 0xf8);
        fdb_doc_update(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                       (size_t)in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                       (size_t)in_stack_fffffffffffff688);
        fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff688 + (long)n * 8));
      }
      fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      fdb_kvs_open_default
                (in_stack_fffffffffffff690,(fdb_kvs_handle **)in_stack_fffffffffffff688,
                 (fdb_kvs_config *)0x106496);
      fVar1 = fdb_set_log_callback(local_600,logCallbackFunc,"compact_with_reopen_test");
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1c8);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1c8,"void compact_with_reopen_test()");
        }
      }
      fVar1 = fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1cb);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1cb,"void compact_with_reopen_test()");
        }
      }
      fVar1 = fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1ce);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1ce,"void compact_with_reopen_test()");
        }
      }
      fVar1 = fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1d2);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1d2,"void compact_with_reopen_test()");
        }
      }
      fdb_kvs_close(in_stack_fffffffffffff688);
      pvVar3 = (void *)0x10668d;
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
      n = 0;
      while( true ) {
        if (99 < n) {
          fVar1 = fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8a8);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1e4);
            compact_with_reopen_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x1e4,"void compact_with_reopen_test()");
            }
          }
          fVar1 = fdb_kvs_open_default
                            (in_stack_fffffffffffff690,(fdb_kvs_handle **)in_stack_fffffffffffff688,
                             (fdb_kvs_config *)0x106927);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1e6);
            compact_with_reopen_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x1e6,"void compact_with_reopen_test()");
            }
          }
          fVar1 = fdb_set_log_callback
                            ((fdb_kvs_handle *)doc,logCallbackFunc,"compact_with_reopen_test");
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1e9);
            compact_with_reopen_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x1e9,"void compact_with_reopen_test()");
            }
          }
          fdb_get_file_info(in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
          iVar2 = strcmp("./compact_test1.3",(char *)second_dbfile);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1ec);
            compact_with_reopen_test::__test_pass = 0;
            iVar2 = strcmp("./compact_test1.3",(char *)second_dbfile);
            if (iVar2 != 0) {
              __assert_fail("!strcmp(\"./compact_test1.3\", info.filename)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x1ec,"void compact_with_reopen_test()");
            }
          }
          fdb_kvs_close(in_stack_fffffffffffff688);
          pvVar3 = (void *)0x106ac2;
          fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
          n = 0;
          while( true ) {
            if (99 < n) {
              fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
              fdb_kvs_close(in_stack_fffffffffffff688);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
              system("mv  compact_test1 compact_test.fdb > errorlog.txt");
              fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8
                      );
              fdb_kvs_open_default
                        (in_stack_fffffffffffff690,(fdb_kvs_handle **)in_stack_fffffffffffff688,
                         (fdb_kvs_config *)0x106d1e);
              fVar1 = fdb_set_log_callback
                                ((fdb_kvs_handle *)doc,logCallbackFunc,"compact_with_reopen_test");
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x206);
                compact_with_reopen_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x206,"void compact_with_reopen_test()");
                }
              }
              fdb_compact(in_stack_fffffffffffff690,(char *)in_stack_fffffffffffff688);
              fdb_kvs_close(in_stack_fffffffffffff688);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
              fVar1 = fdb_open(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                               in_stack_fffffffffffff8a8);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x20d);
                compact_with_reopen_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x20d,"void compact_with_reopen_test()");
                }
              }
              fVar1 = fdb_kvs_open_default
                                (in_stack_fffffffffffff690,
                                 (fdb_kvs_handle **)in_stack_fffffffffffff688,
                                 (fdb_kvs_config *)0x106e51);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x20f);
                compact_with_reopen_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x20f,"void compact_with_reopen_test()");
                }
              }
              fVar1 = fdb_set_log_callback
                                ((fdb_kvs_handle *)doc,logCallbackFunc,"compact_with_reopen_test");
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x212);
                compact_with_reopen_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x212,"void compact_with_reopen_test()");
                }
              }
              fdb_get_file_info(in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
              iVar2 = strcmp("./compact_test.fdb",(char *)second_dbfile);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x214);
                compact_with_reopen_test::__test_pass = 0;
                iVar2 = strcmp("./compact_test.fdb",(char *)second_dbfile);
                if (iVar2 != 0) {
                  __assert_fail("!strcmp(\"./compact_test.fdb\", info.filename)",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x214,"void compact_with_reopen_test()");
                }
              }
              if (info.new_filename != (char *)0x64) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x215);
                compact_with_reopen_test::__test_pass = 0;
                if (info.new_filename != (char *)0x64) {
                  __assert_fail("info.doc_count == 100",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                                ,0x215,"void compact_with_reopen_test()");
                }
              }
              for (n = 0; n < 100; n = n + 1) {
                fdb_doc_free((fdb_doc *)0x107059);
              }
              fdb_kvs_close(in_stack_fffffffffffff688);
              fdb_close((fdb_file_handle *)in_stack_fffffffffffff688);
              fdb_shutdown();
              memleak_end();
              if (compact_with_reopen_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n","compaction with reopen test");
              }
              else {
                fprintf(_stderr,"%s PASSED\n","compaction with reopen test");
              }
              return;
            }
            fdb_doc_create(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                           (size_t)in_stack_fffffffffffff688,pvVar3,0,(void *)0x106b14,
                           in_stack_fffffffffffff6b0);
            fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_88);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1f5);
              compact_with_reopen_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                              ,0x1f5,"void compact_with_reopen_test()");
              }
            }
            iVar2 = memcmp(pfStack_88->meta,
                           *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
                           pfStack_88->metalen);
            if (iVar2 != 0) break;
            iVar2 = memcmp(pfStack_88->body,
                           *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                           pfStack_88->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                      *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                      pfStack_88->body,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1f7);
              compact_with_reopen_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                            ,0x1f7,"void compact_with_reopen_test()");
            }
            pvVar3 = (void *)0x106cb7;
            fdb_doc_free((fdb_doc *)0x106cb7);
            n = n + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
                  pfStack_88->meta,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1f6);
          compact_with_reopen_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1f6,"void compact_with_reopen_test()");
        }
        fdb_doc_create(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                       (size_t)in_stack_fffffffffffff688,pvVar3,0,(void *)0x1066df,
                       in_stack_fffffffffffff6b0);
        fVar1 = fdb_get(local_600,pfStack_88);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1db);
          compact_with_reopen_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x1db,"void compact_with_reopen_test()");
          }
        }
        iVar2 = memcmp(pfStack_88->meta,
                       *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
                       pfStack_88->metalen);
        if (iVar2 != 0) break;
        iVar2 = memcmp(pfStack_88->body,
                       *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                       pfStack_88->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                  *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                  pfStack_88->body,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x1dd);
          compact_with_reopen_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1dd,"void compact_with_reopen_test()");
        }
        pvVar3 = (void *)0x106885;
        fdb_doc_free((fdb_doc *)0x106885);
        n = n + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
              pfStack_88->meta,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x1dc);
      compact_with_reopen_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x1dc,"void compact_with_reopen_test()");
    }
    fdb_doc_create(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                   (size_t)in_stack_fffffffffffff688,pvVar3,0,(void *)0x1060c4,
                   in_stack_fffffffffffff6b0);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,pfStack_88);
    if (n == 1) {
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1ad);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1ad,"void compact_with_reopen_test()");
        }
      }
    }
    else {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1a9);
        compact_with_reopen_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x1a9,"void compact_with_reopen_test()");
        }
      }
      iVar2 = memcmp(pfStack_88->meta,
                     *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
                     pfStack_88->metalen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x38),
                pfStack_88->meta,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1aa);
        compact_with_reopen_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1aa,"void compact_with_reopen_test()");
      }
      iVar2 = memcmp(pfStack_88->body,
                     *(void **)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                     pfStack_88->bodylen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffff688 + (long)n * 8) + 0x40),
                pfStack_88->body,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x1ab);
        compact_with_reopen_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x1ab,"void compact_with_reopen_test()");
      }
    }
    pvVar3 = (void *)0x1062d8;
    fdb_doc_free((fdb_doc *)0x1062d8);
    n = n + 1;
  } while( true );
}

Assistant:

void compact_with_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test2 compact_test1 > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test1", info.filename));

    // update documents
    for (i=0;i<n;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
                       (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // Open the database with another handle.
    fdb_file_handle *second_dbfile;
    fdb_kvs_handle *second_dbh;
    fdb_open(&second_dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(second_dbfile, &second_dbh, &kvs_config);
    status = fdb_set_log_callback(second_dbh, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compactions with a handle still open on the first old file
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // MB-12977: retest compaction again..
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(second_dbh, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    // The actual file name should be a compacted one.
    TEST_CHK(!strcmp("./compact_test1.3", info.filename));

    fdb_kvs_close(second_dbh);
    fdb_close(second_dbfile);

    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    r = system(SHELL_MOVE " compact_test1 compact_test.fdb > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // In-place compaction
    fdb_compact(dbfile, NULL);
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // Open database with an original name.
    status = fdb_open(&dbfile, "./compact_test.fdb", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_with_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp("./compact_test.fdb", info.filename));
    TEST_CHK(info.doc_count == 100);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction with reopen test");
}